

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

int event_callback_activate_later_nolock_(event_base *base,event_callback *evcb)

{
  unsigned_long uVar1;
  unsigned_long uVar2;
  event_callback *evcb_local;
  event_base *base_local;
  
  if ((evcb->evcb_flags & 0x28U) == 0) {
    event_queue_insert_active_later(base,evcb);
    if ((evthread_id_fn_ != (_func_unsigned_long *)0x0) && (base->running_loop != 0)) {
      uVar1 = base->th_owner_id;
      uVar2 = (*evthread_id_fn_)();
      if (uVar1 != uVar2) {
        evthread_notify_base(base);
      }
    }
    base_local._4_4_ = 1;
  }
  else {
    base_local._4_4_ = 0;
  }
  return base_local._4_4_;
}

Assistant:

int
event_callback_activate_later_nolock_(struct event_base *base,
    struct event_callback *evcb)
{
	if (evcb->evcb_flags & (EVLIST_ACTIVE|EVLIST_ACTIVE_LATER))
		return 0;

	event_queue_insert_active_later(base, evcb);
	if (EVBASE_NEED_NOTIFY(base))
		evthread_notify_base(base);
	return 1;
}